

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestMutualRecursionA::SharedDtor(MessageLite *self)

{
  TestMutualRecursionB *this;
  TestMutualRecursionA_SubGroup *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (TestMutualRecursionB *)self[3]._vptr_MessageLite;
    if (this != (TestMutualRecursionB *)0x0) {
      TestMutualRecursionB::~TestMutualRecursionB(this);
    }
    operator_delete(this,0x28);
    this_00 = (TestMutualRecursionA_SubGroup *)self[3]._internal_metadata_.ptr_;
    if (this_00 != (TestMutualRecursionA_SubGroup *)0x0) {
      TestMutualRecursionA_SubGroup::~TestMutualRecursionA_SubGroup(this_00);
    }
    operator_delete(this_00,0x28);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR>::
    ~RepeatedPtrField((RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *)
                      &self[1]._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
             ,0x5a48,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestMutualRecursionA::SharedDtor(MessageLite& self) {
  TestMutualRecursionA& this_ = static_cast<TestMutualRecursionA&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.bb_;
  delete this_._impl_.subgroup_;
  this_._impl_.~Impl_();
}